

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

DdNode * Llb_Nonlin4ComputeCube
                   (DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,char *pValues,int Flag)

{
  int iVar1;
  abctime aVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  DdNode *pDVar6;
  uint uVar7;
  DdNode *g;
  DdNode *f;
  void *pvVar8;
  int iVar9;
  
  aVar2 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar6 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar6);
  if (0 < pAig->nRegs) {
    iVar9 = 0;
    f = pDVar6;
    do {
      uVar5 = pAig->nTruePos + iVar9;
      if (((((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) ||
          (uVar7 = pAig->nTruePis + iVar9, (int)uVar7 < 0)) || (pAig->vCis->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAig->vCos->pArray[uVar5];
      pvVar4 = pAig->vCis->pArray[uVar7];
      pvVar8 = pvVar3;
      if (Flag == 0) {
        pvVar8 = pvVar4;
        pvVar4 = pvVar3;
      }
      iVar1 = *(int *)((long)pvVar4 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
LAB_008354e3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar6 = Cudd_bddIthVar(dd,vOrder->pArray[iVar1]);
      iVar1 = *(int *)((long)pvVar8 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) goto LAB_008354e3;
      g = (DdNode *)((ulong)pDVar6 ^ 1);
      if (pValues[vOrder->pArray[iVar1]] == '\x01') {
        g = pDVar6;
      }
      pDVar6 = Cudd_bddAnd(dd,f,g);
      Cudd_Ref(pDVar6);
      Cudd_RecursiveDeref(dd,f);
      iVar9 = iVar9 + 1;
      f = pDVar6;
    } while (iVar9 < pAig->nRegs);
  }
  Cudd_Deref(pDVar6);
  dd->TimeStop = aVar2;
  return pDVar6;
}

Assistant:

DdNode * Llb_Nonlin4ComputeCube( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, char * pValues, int Flag )
{
    Aig_Obj_t * pObjLo, * pObjLi, * pObjTemp;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        if ( Flag )
            pObjTemp = pObjLo, pObjLo = pObjLi, pObjLi = pObjTemp;
        // get the correspoding flop input variable
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLi) );
        if ( pValues[Llb_ObjBddVar(vOrder, pObjLo)] != 1 )
            bVar = Cudd_Not(bVar);
        // create cube
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}